

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jansson_helper.c
# Opt level: O0

json_t * get_root_option_json_object(char *json_string)

{
  undefined1 local_11c [8];
  json_error_t error;
  json_t *root;
  char *json_string_local;
  
  error.text._152_8_ = json_loads(json_string,0,(json_error_t *)local_11c);
  if ((json_t *)error.text._152_8_ == (json_t *)0x0) {
    fprintf(_stderr,"json error in options: on line %d: %s\n",(ulong)(uint)local_11c._0_4_,
            error.source + 0x48);
    json_string_local = (char *)0x0;
  }
  else if (((json_t *)error.text._152_8_ == (json_t *)0x0) ||
          (json_string_local = (char *)error.text._152_8_,
          ((json_t *)error.text._152_8_)->type != JSON_OBJECT)) {
    fprintf(_stderr,"json error in options: root is not an object\n");
    json_decref((json_t *)error.text._152_8_);
    json_string_local = (char *)0x0;
  }
  return (json_t *)json_string_local;
}

Assistant:

json_t * get_root_option_json_object(const char * json_string)
{
	json_t * root;
	json_error_t error;

	root = json_loads(json_string, 0, &error);
	if (!root)
	{
		fprintf(stderr, "json error in options: on line %d: %s\n", error.line, error.text);
		return NULL;
	}

	if (!json_is_object(root))
	{
		fprintf(stderr, "json error in options: root is not an object\n");
		json_decref(root);
		return NULL;
	}

	return root;
}